

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O3

TokenStream * __thiscall
glslang::TPpContext::PrescanMacroArg
          (TPpContext *this,TokenStream *arg,TPpToken *ppToken,bool newLineOkay)

{
  uint token;
  MacroExpandResult MVar1;
  TokenStream *this_00;
  TPoolAllocator *pTVar2;
  tInput *in;
  
  this_00 = (TokenStream *)operator_new(0x28);
  pTVar2 = GetThreadPoolAllocator();
  (this_00->stream).
  super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
  .
  super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
  ._M_impl.super__Tp_alloc_type.allocator = pTVar2;
  (this_00->stream).
  super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
  .
  super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->stream).
  super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
  .
  super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->stream).
  super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
  .
  super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->currentPos = 0;
  in = (tInput *)operator_new(0x18);
  in->done = false;
  in->pp = this;
  in->_vptr_tInput = (_func_int **)&PTR__tInput_00affd58;
  pushInput(this,in);
  pushTokenStreamInput(this,arg,false,false);
  token = scanToken(this,ppToken);
  do {
    if ((~token & 0xfffffffd) == 0) goto LAB_004cb52a;
    token = tokenPaste(this,token,ppToken);
    if (token == 0xa2) {
      MVar1 = MacroExpand(this,ppToken,false,newLineOkay);
      if (1 < MVar1 - MacroExpandStarted) {
        if (MVar1 != MacroExpandError) goto LAB_004cb507;
        do {
          token = scanToken(this,ppToken);
        } while ((~token & 0xfffffffd) != 0);
LAB_004cb52a:
        if (token != 0xfffffffd) {
          operator_delete(this_00,0x28);
          this_00 = (TokenStream *)0x0;
        }
        return this_00;
      }
    }
    else {
      if ((~token & 0xfffffffd) == 0) goto LAB_004cb52a;
LAB_004cb507:
      TokenStream::putToken(this_00,token,ppToken);
    }
    token = scanToken(this,ppToken);
  } while( true );
}

Assistant:

TPpContext::TokenStream* TPpContext::PrescanMacroArg(TokenStream& arg, TPpToken* ppToken, bool newLineOkay)
{
    // expand the argument
    TokenStream* expandedArg = new TokenStream;
    pushInput(new tMarkerInput(this));
    pushTokenStreamInput(arg);
    int token;
    while ((token = scanToken(ppToken)) != tMarkerInput::marker && token != EndOfInput) {
        token = tokenPaste(token, *ppToken);
        if (token == PpAtomIdentifier) {
            switch (MacroExpand(ppToken, false, newLineOkay)) {
            case MacroExpandNotStarted:
                break;
            case MacroExpandError:
                // toss the rest of the pushed-input argument by scanning until tMarkerInput
                while ((token = scanToken(ppToken)) != tMarkerInput::marker && token != EndOfInput)
                    ;
                break;
            case MacroExpandStarted:
            case MacroExpandUndef:
                continue;
            }
        }
        if (token == tMarkerInput::marker || token == EndOfInput)
            break;
        expandedArg->putToken(token, ppToken);
    }

    if (token != tMarkerInput::marker) {
        // Error, or MacroExpand ate the marker, so had bad input, recover
        delete expandedArg;
        expandedArg = nullptr;
    }

    return expandedArg;
}